

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvtBroadphase.cpp
# Opt level: O1

void __thiscall
btDbvtBroadphase::setAabb
          (btDbvtBroadphase *this,btBroadphaseProxy *absproxy,btVector3 *aabbMin,btVector3 *aabbMax,
          btDispatcher *param_4)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  undefined4 uVar6;
  bool bVar7;
  btDbvtNode *pbVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  btVector3 velocity;
  btDbvtVolume aabb;
  undefined1 local_60 [24];
  btDbvtVolume local_48;
  
  local_48.mi.m_floats._0_8_ = *(undefined8 *)aabbMin->m_floats;
  local_48.mi.m_floats._8_8_ = *(undefined8 *)(aabbMin->m_floats + 2);
  local_48.mx.m_floats._0_8_ = *(undefined8 *)aabbMax->m_floats;
  local_48.mx.m_floats._8_8_ = *(undefined8 *)(aabbMax->m_floats + 2);
  if (absproxy[1].m_uniqueId == 2) {
    btDbvt::remove((btDbvt *)&this->field_0x68,(char *)absproxy[1].m_clientObject);
    pbVar8 = btDbvt::insert((btDbvt *)&this->field_0x8,&local_48,absproxy);
    absproxy[1].m_clientObject = pbVar8;
  }
  else {
    this->m_updates_call = this->m_updates_call + 1;
    pbVar8 = (btDbvtNode *)absproxy[1].m_clientObject;
    if ((((((pbVar8->volume).mi.m_floats[0] <= local_48.mx.m_floats[0]) &&
          (local_48.mi.m_floats[0] <= (pbVar8->volume).mx.m_floats[0])) &&
         ((pbVar8->volume).mi.m_floats[1] <= local_48.mx.m_floats[1])) &&
        ((local_48.mi.m_floats[1] <= (pbVar8->volume).mx.m_floats[1] &&
         ((pbVar8->volume).mi.m_floats[2] <= local_48.mx.m_floats[2])))) &&
       (local_48.mi.m_floats[2] <= (pbVar8->volume).mx.m_floats[2])) {
      fVar1 = (absproxy->m_aabbMin).m_floats[2];
      fVar2 = this->m_prediction;
      uVar3 = *(undefined8 *)(absproxy->m_aabbMin).m_floats;
      uVar4 = *(undefined8 *)(absproxy->m_aabbMax).m_floats;
      fVar9 = (float)uVar3;
      fVar10 = (float)((ulong)uVar3 >> 0x20);
      fVar11 = fVar2 * ((float)uVar4 - fVar9) * 0.5;
      local_60._4_4_ = fVar2 * ((float)((ulong)uVar4 >> 0x20) - fVar10) * 0.5;
      local_60._0_4_ = fVar11;
      local_60._8_4_ = ((absproxy->m_aabbMax).m_floats[2] - fVar1) * 0.5 * fVar2;
      if (aabbMin->m_floats[0] < fVar9) {
        local_60._4_8_ = local_60._4_8_;
        local_60._0_4_ = -fVar11;
      }
      if (aabbMin->m_floats[1] < fVar10) {
        uVar6 = local_60._8_4_;
        local_60._0_8_ = local_60._0_8_ ^ 0x8000000000000000;
        local_60._8_4_ = uVar6;
      }
      if (aabbMin->m_floats[2] < fVar1) {
        local_60._8_4_ = -(float)local_60._8_4_;
      }
      local_60._12_4_ = 0;
      bVar7 = btDbvt::update((btDbvt *)&this->field_0x8,pbVar8,&local_48,(btVector3 *)local_60,0.05)
      ;
      if (bVar7) {
        this->m_updates_done = this->m_updates_done + 1;
      }
      goto LAB_00135acd;
    }
    btDbvt::update((btDbvt *)&this->field_0x8,pbVar8,&local_48);
    this->m_updates_done = this->m_updates_done + 1;
  }
  bVar7 = true;
LAB_00135acd:
  if (*(long *)&absproxy[1].m_collisionFilterGroup == 0) {
    this->m_stageRoots[absproxy[1].m_uniqueId] = (btDbvtProxy *)absproxy[1].m_multiSapParentProxy;
  }
  else {
    *(void **)(*(long *)&absproxy[1].m_collisionFilterGroup + 0x50) =
         absproxy[1].m_multiSapParentProxy;
  }
  if (absproxy[1].m_multiSapParentProxy != (void *)0x0) {
    *(undefined8 *)((long)absproxy[1].m_multiSapParentProxy + 0x48) =
         *(undefined8 *)&absproxy[1].m_collisionFilterGroup;
  }
  uVar3 = *(undefined8 *)(aabbMin->m_floats + 2);
  *(undefined8 *)(absproxy->m_aabbMin).m_floats = *(undefined8 *)aabbMin->m_floats;
  *(undefined8 *)((absproxy->m_aabbMin).m_floats + 2) = uVar3;
  uVar3 = *(undefined8 *)(aabbMax->m_floats + 2);
  *(undefined8 *)(absproxy->m_aabbMax).m_floats = *(undefined8 *)aabbMax->m_floats;
  *(undefined8 *)((absproxy->m_aabbMax).m_floats + 2) = uVar3;
  iVar5 = this->m_stageCurrent;
  absproxy[1].m_uniqueId = iVar5;
  absproxy[1].m_collisionFilterGroup = 0;
  absproxy[1].m_collisionFilterMask = 0;
  *(undefined4 *)&absproxy[1].field_0xc = 0;
  absproxy[1].m_multiSapParentProxy = this->m_stageRoots[iVar5];
  if (this->m_stageRoots[iVar5] != (btDbvtProxy *)0x0) {
    this->m_stageRoots[iVar5]->links[0] = (btDbvtProxy *)absproxy;
  }
  this->m_stageRoots[iVar5] = (btDbvtProxy *)absproxy;
  if ((bVar7 != false) && (this->m_needcleanup = true, this->m_deferedcollide == false)) {
    local_60._8_8_ = this;
    local_60._0_8_ = &PTR__ICollide_00222f80;
    btDbvt::collideTTpersistentStack
              ((btDbvt *)&this->field_0x68,*(btDbvtNode **)&this->field_0x68,
               (btDbvtNode *)absproxy[1].m_clientObject,(ICollide *)local_60);
    btDbvt::collideTTpersistentStack
              ((btDbvt *)&this->field_0x8,*(btDbvtNode **)&this->field_0x8,
               (btDbvtNode *)absproxy[1].m_clientObject,(ICollide *)local_60);
  }
  return;
}

Assistant:

void							btDbvtBroadphase::setAabb(		btBroadphaseProxy* absproxy,
														  const btVector3& aabbMin,
														  const btVector3& aabbMax,
														  btDispatcher* /*dispatcher*/)
{
	btDbvtProxy*						proxy=(btDbvtProxy*)absproxy;
	ATTRIBUTE_ALIGNED16(btDbvtVolume)	aabb=btDbvtVolume::FromMM(aabbMin,aabbMax);
#if DBVT_BP_PREVENTFALSEUPDATE
	if(NotEqual(aabb,proxy->leaf->volume))
#endif
	{
		bool	docollide=false;
		if(proxy->stage==STAGECOUNT)
		{/* fixed -> dynamic set	*/ 
			m_sets[1].remove(proxy->leaf);
			proxy->leaf=m_sets[0].insert(aabb,proxy);
			docollide=true;
		}
		else
		{/* dynamic set				*/ 
			++m_updates_call;
			if(Intersect(proxy->leaf->volume,aabb))
			{/* Moving				*/ 

				const btVector3	delta=aabbMin-proxy->m_aabbMin;
				btVector3		velocity(((proxy->m_aabbMax-proxy->m_aabbMin)/2)*m_prediction);
				if(delta[0]<0) velocity[0]=-velocity[0];
				if(delta[1]<0) velocity[1]=-velocity[1];
				if(delta[2]<0) velocity[2]=-velocity[2];
				if	(
#ifdef DBVT_BP_MARGIN				
					m_sets[0].update(proxy->leaf,aabb,velocity,DBVT_BP_MARGIN)
#else
					m_sets[0].update(proxy->leaf,aabb,velocity)
#endif
					)
				{
					++m_updates_done;
					docollide=true;
				}
			}
			else
			{/* Teleporting			*/ 
				m_sets[0].update(proxy->leaf,aabb);
				++m_updates_done;
				docollide=true;
			}	
		}
		listremove(proxy,m_stageRoots[proxy->stage]);
		proxy->m_aabbMin = aabbMin;
		proxy->m_aabbMax = aabbMax;
		proxy->stage	=	m_stageCurrent;
		listappend(proxy,m_stageRoots[m_stageCurrent]);
		if(docollide)
		{
			m_needcleanup=true;
			if(!m_deferedcollide)
			{
				btDbvtTreeCollider	collider(this);
				m_sets[1].collideTTpersistentStack(m_sets[1].m_root,proxy->leaf,collider);
				m_sets[0].collideTTpersistentStack(m_sets[0].m_root,proxy->leaf,collider);
			}
		}	
	}
}